

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::MergeFrom
          (TensorValue_RepeatedBytes *this,TensorValue_RepeatedBytes *from)

{
  LogMessage *other;
  ulong uVar1;
  string *psVar2;
  Arena *pAVar3;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  TensorValue_RepeatedBytes *local_28;
  TensorValue_RepeatedBytes *from_local;
  TensorValue_RepeatedBytes *this_local;
  TensorValue_RepeatedBytes *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x1d29);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  _internal_values_abi_cxx11_(local_28);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = _internal_values_abi_cxx11_(local_28);
    this_local = (TensorValue_RepeatedBytes *)psVar2;
    local_10 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->values_,psVar2,pAVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TensorValue_RepeatedBytes::MergeFrom(const TensorValue_RepeatedBytes& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_values().empty()) {
    _internal_set_values(from._internal_values());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}